

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Detail::rawMemoryToString_abi_cxx11_
          (string *__return_storage_ptr__,Detail *this,void *object,size_t size)

{
  Arch AVar1;
  ReusableStringStream *pRVar2;
  uint local_68;
  _Setw local_64;
  _Setfill<char> local_5d [13];
  undefined1 local_50 [8];
  ReusableStringStream rss;
  uchar *bytes;
  int local_28;
  int inc;
  int end;
  int i;
  size_t size_local;
  void *object_local;
  
  inc = 0;
  local_28 = (int)object;
  bytes._4_4_ = 1;
  AVar1 = anon_unknown_0::Endianness::which();
  if (AVar1 == Little) {
    inc = local_28 + -1;
    bytes._4_4_ = -1;
    local_28 = -1;
  }
  rss.m_oss = (ostream *)this;
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_50);
  pRVar2 = ReusableStringStream::operator<<((ReusableStringStream *)local_50,(char (*) [3])0x3e28a0)
  ;
  local_5d[0] = clara::std::setfill<char>('0');
  pRVar2 = ReusableStringStream::operator<<(pRVar2,local_5d);
  ReusableStringStream::operator<<(pRVar2,clara::std::hex);
  for (; inc != local_28; inc = bytes._4_4_ + inc) {
    local_64 = clara::std::setw(2);
    pRVar2 = ReusableStringStream::operator<<((ReusableStringStream *)local_50,&local_64);
    local_68 = (uint)(byte)rss.m_oss[inc];
    ReusableStringStream::operator<<(pRVar2,&local_68);
  }
  ReusableStringStream::str_abi_cxx11_(__return_storage_ptr__,(ReusableStringStream *)local_50);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string rawMemoryToString( const void *object, std::size_t size ) {
        // Reverse order for little endian architectures
        int i = 0, end = static_cast<int>( size ), inc = 1;
        if( Endianness::which() == Endianness::Little ) {
            i = end-1;
            end = inc = -1;
        }

        unsigned char const *bytes = static_cast<unsigned char const *>(object);
        ReusableStringStream rss;
        rss << "0x" << std::setfill('0') << std::hex;
        for( ; i != end; i += inc )
             rss << std::setw(2) << static_cast<unsigned>(bytes[i]);
       return rss.str();
    }